

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  Value VVar1;
  lua_State *plVar2;
  uint uVar3;
  Value *v;
  char *__assertion;
  TValue k;
  Value local_30;
  undefined2 local_28;
  Value local_20;
  undefined2 local_18;
  
  luaK_exp2val(fs,e);
  switch(e->k) {
  case VNIL:
    local_18 = 0;
    VVar1 = (Value)fs->ls->h;
    if (9 < ((VVar1.gc)->tt & 0xe)) {
      __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_001279e6:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x205,"int nilK(FuncState *)");
    }
    local_28 = 0x8005;
    local_30 = VVar1;
    if (((VVar1.gc)->tt != 5) ||
       ((plVar2 = fs->ls->L, plVar2 != (lua_State *)0x0 &&
        (((VVar1.gc)->marked & (plVar2->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assertion = "0";
      goto LAB_001279e6;
    }
    break;
  case VTRUE:
    local_30.b = 1;
    goto LAB_00127978;
  case VFALSE:
    local_30.i = (ulong)(uint)local_30.i._4_4_ << 0x20;
LAB_00127978:
    local_28 = 1;
LAB_0012797e:
    v = &local_30;
    goto LAB_001279a9;
  case VK:
    uVar3 = (e->u).info;
    goto LAB_001279b1;
  case VKFLT:
    local_30 = (Value)(e->u).ival;
    local_28 = 3;
    goto LAB_0012797e;
  case VKINT:
    local_20 = (Value)(e->u).ival;
    local_28 = 2;
    local_18 = 0x13;
    local_30 = local_20;
    break;
  default:
    goto switchD_001278e4_default;
  }
  v = &local_20;
LAB_001279a9:
  uVar3 = addk(fs,(TValue *)&local_30,(TValue *)v);
  (e->u).info = uVar3;
LAB_001279b1:
  e->k = VK;
  if ((int)uVar3 < 0x80) {
    uVar3 = uVar3 | 0x80;
  }
  else {
switchD_001278e4_default:
    uVar3 = luaK_exp2anyreg(fs,e);
  }
  return uVar3;
}

Assistant:

int luaK_exp2RK (FuncState *fs, expdesc *e) {
  luaK_exp2val(fs, e);
  switch (e->k) {  /* move constants to 'k' */
    case VTRUE: e->u.info = boolK(fs, 1); goto vk;
    case VFALSE: e->u.info = boolK(fs, 0); goto vk;
    case VNIL: e->u.info = nilK(fs); goto vk;
    case VKINT: e->u.info = luaK_intK(fs, e->u.ival); goto vk;
    case VKFLT: e->u.info = luaK_numberK(fs, e->u.nval); goto vk;
    case VK:
     vk:
      e->k = VK;
      if (e->u.info <= MAXINDEXRK)  /* constant fits in 'argC'? */
        return RKASK(e->u.info);
      else break;
    default: break;
  }
  /* not a constant in the right range: put it in a register */
  return luaK_exp2anyreg(fs, e);
}